

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

int32_t icu_63::parseAsciiDigits(UnicodeString *str,int32_t start,int32_t length,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  char16_t cVar3;
  int iVar4;
  int32_t i;
  int iVar5;
  int iVar6;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (length < 1) {
LAB_0020bf4b:
    *status = U_INVALID_FORMAT_ERROR;
    return 0;
  }
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 < length + start || iVar4 < start) goto LAB_0020bf4b;
  cVar3 = UnicodeString::doCharAt(str,start);
  if (cVar3 == L'+') {
    start = start + 1;
    length = length + -1;
  }
  else {
    cVar3 = UnicodeString::doCharAt(str,start);
    if (cVar3 == L'-') {
      start = start + 1;
      length = length + -1;
      iVar4 = -1;
      goto LAB_0020bf91;
    }
  }
  iVar4 = 1;
LAB_0020bf91:
  iVar6 = 0;
  iVar5 = 0;
  do {
    if (length == iVar5) {
      bVar2 = false;
LAB_0020bfdc:
      if (!bVar2) {
        return iVar6 * iVar4;
      }
      return 0;
    }
    cVar3 = UnicodeString::doCharAt(str,start + iVar5);
    if (9 < (ushort)(cVar3 + L'￐')) {
      bVar2 = iVar5 < length;
      *status = U_INVALID_FORMAT_ERROR;
      goto LAB_0020bfdc;
    }
    iVar6 = iVar6 * 10 + (uint)(ushort)cVar3 + -0x30;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static int32_t parseAsciiDigits(const UnicodeString& str, int32_t start, int32_t length, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (length <= 0 || str.length() < start || (start + length) > str.length()) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t sign = 1;
    if (str.charAt(start) == PLUS) {
        start++;
        length--;
    } else if (str.charAt(start) == MINUS) {
        sign = -1;
        start++;
        length--;
    }
    int32_t num = 0;
    for (int32_t i = 0; i < length; i++) {
        int32_t digit = str.charAt(start + i) - 0x0030;
        if (digit < 0 || digit > 9) {
            status = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        num = 10 * num + digit;
    }
    return sign * num;    
}